

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar2;
  string *type;
  string *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraKateGenerator *this_local;
  
  lg = (cmLocalGenerator *)this;
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  mf = (cmMakefile *)*ppcVar2;
  local_20 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)mf);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_60,(cmLocalGenerator *)mf);
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_BUILD_TYPE",&local_81);
  type = cmMakefile::GetSafeDefinition(this_00,&local_80);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)mf);
  GetPathBasename(&local_b8,this,path);
  GenerateProjectName(&local_40,this,&local_60,type,&local_b8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_60);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            ();
  bVar1 = std::operator==(&local_d8,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_d8);
  CreateKateProjectFile(this,(cmLocalGenerator *)mf);
  CreateDummyKateProjectFile(this,(cmLocalGenerator *)mf);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();
  this->ProjectName = this->GenerateProjectName(
    lg->GetProjectName(), mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
    this->GetPathBasename(lg->GetBinaryDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(lg);
  this->CreateDummyKateProjectFile(lg);
}